

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

void __thiscall ncnn::InstanceNorm::InstanceNorm(InstanceNorm *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__InstanceNorm_00557580;
  (this->beta_data).cstep = 0;
  (this->gamma_data).data = (void *)0x0;
  (this->gamma_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->gamma_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->gamma_data).elemsize + 4) = 0;
  (this->gamma_data).allocator = (Allocator *)0x0;
  (this->gamma_data).dims = 0;
  (this->gamma_data).w = 0;
  (this->gamma_data).w = 0;
  (this->gamma_data).h = 0;
  (this->gamma_data).d = 0;
  (this->gamma_data).c = 0;
  (this->gamma_data).cstep = 0;
  (this->beta_data).data = (void *)0x0;
  (this->beta_data).elempack = 0;
  (this->beta_data).refcount = (int *)0x0;
  (this->beta_data).elemsize = 0;
  (this->beta_data).allocator = (Allocator *)0x0;
  (this->beta_data).dims = 0;
  (this->beta_data).w = 0;
  (this->beta_data).w = 0;
  (this->beta_data).h = 0;
  (this->beta_data).d = 0;
  (this->beta_data).c = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  return;
}

Assistant:

InstanceNorm::InstanceNorm()
{
    one_blob_only = true;
    support_inplace = true;
}